

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall
cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes32> *this,cmELF *external,
          unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  cmELF *pcVar4;
  char *pcVar5;
  bool bVar6;
  FileType FVar7;
  ELF_Half i;
  ostringstream e;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pbVar3 = (fin->_M_t).
           super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  (fin->_M_t).
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)0x0;
  (this->super_cmELFInternal).External = external;
  (this->super_cmELFInternal).Stream._M_t.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       pbVar3;
  (this->super_cmELFInternal).ByteOrder = order;
  (this->super_cmELFInternal).ELFType = FileTypeInvalid;
  p_Var1 = &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header;
  (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  (this->super_cmELFInternal).NeedSwap = order == ByteOrderMSB;
  (this->super_cmELFInternal).DynamicSectionIndex = -1;
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_0085d968;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = Read(this,&this->ELFHeader);
  if (bVar6) {
    uVar2 = (this->ELFHeader).e_type;
    FVar7 = (FileType)uVar2;
    switch(uVar2) {
    case 0:
      pcVar4 = (this->super_cmELFInternal).External;
      std::__cxx11::string::_M_replace
                ((ulong)&pcVar4->ErrorMessage,0,(char *)(pcVar4->ErrorMessage)._M_string_length,
                 0x6b19fa);
      goto LAB_002f7280;
    case 1:
      break;
    case 2:
      FVar7 = FileTypeExecutable;
      break;
    case 3:
      FVar7 = FileTypeSharedLibrary;
      break;
    case 4:
      FVar7 = FileTypeCore;
      break;
    default:
      FVar7 = FileTypeSpecificOS;
      if (((uVar2 & 0xff00) != 0xfe00) && (FVar7 = FileTypeSpecificProc, uVar2 < 0xff00)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unknown ELF file type ",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        pcVar4 = (this->super_cmELFInternal).External;
        pcVar5 = (char *)(pcVar4->ErrorMessage)._M_string_length;
        strlen((char *)local_1c8);
        std::__cxx11::string::_M_replace((ulong)&pcVar4->ErrorMessage,0,pcVar5,(ulong)local_1c8);
        (this->super_cmELFInternal).ELFType = FileTypeInvalid;
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        return;
      }
    }
    (this->super_cmELFInternal).ELFType = FVar7;
    (this->super_cmELFInternal).Machine = (this->ELFHeader).e_machine;
    std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::resize
              (&this->SectionHeaders,(ulong)(this->ELFHeader).e_shnum);
    if ((this->ELFHeader).e_shnum != 0) {
      i = 0;
      do {
        bVar6 = LoadSectionHeader(this,i);
        if (!bVar6) {
          pcVar4 = (this->super_cmELFInternal).External;
          std::__cxx11::string::_M_replace
                    ((ulong)&pcVar4->ErrorMessage,0,(char *)(pcVar4->ErrorMessage)._M_string_length,
                     0x6b1a28);
          goto LAB_002f7280;
        }
        i = i + 1;
      } while (i < (this->ELFHeader).e_shnum);
    }
  }
  else {
    pcVar4 = (this->super_cmELFInternal).External;
    std::__cxx11::string::_M_replace
              ((ulong)&pcVar4->ErrorMessage,0,(char *)(pcVar4->ErrorMessage)._M_string_length,
               0x6b19da);
LAB_002f7280:
    (this->super_cmELFInternal).ELFType = FileTypeInvalid;
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(cmELF* external,
                                            std::unique_ptr<std::istream> fin,
                                            ByteOrderType order)
  : cmELFInternal(external, std::move(fin), order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  this->Machine = this->ELFHeader.e_machine;

  // Load the section headers.
  this->SectionHeaders.resize(this->ELFHeader.e_shnum);
  for (ELF_Half i = 0; i < this->ELFHeader.e_shnum; ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}